

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderPerformanceMeasurer::render(ShaderPerformanceMeasurer *this,int numDrawCalls)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int local_28;
  int callNdx;
  GLsizei numIndices;
  Functions *gl;
  int numDrawCalls_local;
  ShaderPerformanceMeasurer *this_local;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  iVar2 = getNumIndices(this->m_gridSizeX,this->m_gridSizeY);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1a00))
            (0,0,this->m_viewportWidth,this->m_viewportHeight);
  for (local_28 = 0; local_28 < numDrawCalls; local_28 = local_28 + 1) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x568))(4,iVar2,0x1403,0);
  }
  return;
}

Assistant:

void ShaderPerformanceMeasurer::render (int numDrawCalls)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	GLsizei					numIndices	= (GLsizei)getNumIndices(m_gridSizeX, m_gridSizeY);

	gl.viewport(0, 0, m_viewportWidth, m_viewportHeight);

	for (int callNdx = 0; callNdx < numDrawCalls; callNdx++)
		gl.drawElements(GL_TRIANGLES, numIndices, GL_UNSIGNED_SHORT, DE_NULL);
}